

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_avx2.c
# Opt level: O2

int32_t mm256_accumulate_epi16(__m256i vec_a)

{
  undefined1 auVar1 [16];
  int32_t iVar2;
  undefined1 in_ZMM0 [64];
  
  auVar1 = vphaddw_avx(in_ZMM0._16_16_,in_ZMM0._0_16_);
  auVar1 = vphaddw_avx(auVar1,auVar1);
  auVar1 = vphaddw_avx(auVar1,auVar1);
  auVar1 = vphaddw_avx(auVar1,auVar1);
  iVar2 = vpextrw_avx(auVar1,0);
  return iVar2;
}

Assistant:

static inline int32_t mm256_accumulate_epi16(__m256i vec_a) {
  __m128i vtmp1 = _mm256_extracti128_si256(vec_a, 1);
  __m128i vtmp2 = _mm256_castsi256_si128(vec_a);
  vtmp1 = _mm_add_epi16(vtmp1, vtmp2);
  vtmp2 = _mm_srli_si128(vtmp1, 8);
  vtmp1 = _mm_add_epi16(vtmp1, vtmp2);
  vtmp2 = _mm_srli_si128(vtmp1, 4);
  vtmp1 = _mm_add_epi16(vtmp1, vtmp2);
  vtmp2 = _mm_srli_si128(vtmp1, 2);
  vtmp1 = _mm_add_epi16(vtmp1, vtmp2);
  return _mm_extract_epi16(vtmp1, 0);
}